

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
av1_create_context_and_bufferpool
          (AV1_PRIMARY *ppi,AV1_COMP **p_cpi,BufferPool **p_buffer_pool,AV1EncoderConfig *oxcf,
          COMPRESSOR_STAGE stage,int lap_lag_in_frames)

{
  undefined1 uVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  void *pvVar3;
  AV1_COMP *pAVar4;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  BufferPool *buffer_pool;
  aom_codec_err_t res;
  uint in_stack_ffffffffffffffc8;
  aom_codec_err_t local_4;
  
  local_4 = AOM_CODEC_OK;
  if (*in_RDX == 0) {
    __mutex = (pthread_mutex_t *)aom_calloc((ulong)in_stack_ffffffffffffffc8,0);
    if (__mutex == (pthread_mutex_t *)0x0) {
      return AOM_CODEC_MEM_ERROR;
    }
    uVar1 = 0x10;
    if (*(char *)(in_RCX + 0x450) == '\x02') {
      uVar1 = 2;
    }
    *(undefined1 *)((long)__mutex + 0x48) = uVar1;
    pvVar3 = aom_calloc(CONCAT44(local_4,in_stack_ffffffffffffffc8),(size_t)__mutex);
    *(void **)((long)__mutex + 0x40) = pvVar3;
    if (*(long *)((long)__mutex + 0x40) == 0) {
      *(undefined1 *)((long)__mutex + 0x48) = 0;
      aom_free(__mutex);
      return AOM_CODEC_MEM_ERROR;
    }
    iVar2 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar2 != 0) {
      aom_free(__mutex);
      *(undefined8 *)((long)__mutex + 0x40) = 0;
      *(undefined1 *)((long)__mutex + 0x48) = 0;
      aom_free(__mutex);
      return AOM_CODEC_MEM_ERROR;
    }
    *in_RDX = (long)__mutex;
  }
  pAVar4 = av1_create_compressor
                     (ppi,(AV1EncoderConfig *)p_cpi,(BufferPool *)p_buffer_pool,oxcf._7_1_,(int)oxcf
                     );
  *in_RSI = (long)pAVar4;
  if (*in_RSI == 0) {
    local_4 = AOM_CODEC_MEM_ERROR;
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_create_context_and_bufferpool(AV1_PRIMARY *ppi,
                                                  AV1_COMP **p_cpi,
                                                  BufferPool **p_buffer_pool,
                                                  const AV1EncoderConfig *oxcf,
                                                  COMPRESSOR_STAGE stage,
                                                  int lap_lag_in_frames) {
  aom_codec_err_t res = AOM_CODEC_OK;
  BufferPool *buffer_pool = *p_buffer_pool;

  if (buffer_pool == NULL) {
    buffer_pool = (BufferPool *)aom_calloc(1, sizeof(BufferPool));
    if (buffer_pool == NULL) return AOM_CODEC_MEM_ERROR;
    buffer_pool->num_frame_bufs =
        (oxcf->mode == ALLINTRA) ? FRAME_BUFFERS_ALLINTRA : FRAME_BUFFERS;
    buffer_pool->frame_bufs = (RefCntBuffer *)aom_calloc(
        buffer_pool->num_frame_bufs, sizeof(*buffer_pool->frame_bufs));
    if (buffer_pool->frame_bufs == NULL) {
      buffer_pool->num_frame_bufs = 0;
      aom_free(buffer_pool);
      return AOM_CODEC_MEM_ERROR;
    }
#if CONFIG_MULTITHREAD
    if (pthread_mutex_init(&buffer_pool->pool_mutex, NULL)) {
      aom_free(buffer_pool->frame_bufs);
      buffer_pool->frame_bufs = NULL;
      buffer_pool->num_frame_bufs = 0;
      aom_free(buffer_pool);
      return AOM_CODEC_MEM_ERROR;
    }
#endif
    *p_buffer_pool = buffer_pool;
  }
  *p_cpi =
      av1_create_compressor(ppi, oxcf, buffer_pool, stage, lap_lag_in_frames);
  if (*p_cpi == NULL) res = AOM_CODEC_MEM_ERROR;

  return res;
}